

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::DummyService::request
          (DummyService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  ArrayDisposer **this_00;
  bool bVar1;
  kj *pkVar2;
  AsyncOutputStream *pAVar3;
  char *pcVar4;
  size_t sVar5;
  Own<kj::AsyncOutputStream> *attachments_1;
  WebSocket *pWVar6;
  DummyService *params;
  PromiseNode *extraout_RDX;
  size_t size;
  PromiseNode *extraout_RDX_00;
  size_t size_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar7;
  undefined4 in_register_00000034;
  long lVar8;
  ArrayPtr<const_char> AVar9;
  Promise<void> PVar10;
  long *in_stack_00000010;
  Array<kj::Promise<void>_> local_480;
  Own<kj::WebSocket> local_468;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_458;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_448;
  Promise<void> local_438;
  undefined1 local_428 [8];
  ArrayBuilder<kj::Promise<void>_> promises_1;
  undefined1 local_3f8 [8];
  Promise<void> sendPromise;
  Maybe<kj::StringPtr> local_3c8;
  undefined1 local_3b0 [8];
  String body_1;
  undefined1 local_338 [8];
  Own<kj::WebSocket> ws;
  Own<kj::AsyncOutputStream> local_310;
  Promise<kj::Array<unsigned_char>_> local_300;
  Promise<kj::Array<unsigned_char>_> local_2f0;
  Promise<void> local_2e0;
  undefined1 local_2d0 [8];
  ArrayBuilder<kj::Promise<void>_> promises;
  Maybe<unsigned_long> local_2a8;
  HttpHeaders local_298;
  StringPtr local_238;
  undefined1 local_228 [8];
  Own<kj::AsyncOutputStream> stream;
  Maybe<kj::StringPtr> local_1f8;
  undefined1 local_1e0 [8];
  String body;
  String local_1b8;
  Exception local_1a0;
  StringPtr local_48;
  HttpHeaders *local_38;
  HttpHeaders *headers_local;
  long lStack_28;
  HttpMethod method_local;
  DummyService *this_local;
  StringPtr url_local;
  
  lVar8 = CONCAT44(in_register_00000034,method);
  params = (DummyService *)url.content.size_;
  headers_local._4_4_ = url.content.ptr._0_4_;
  local_38 = (HttpHeaders *)requestBody;
  lStack_28 = lVar8;
  this_local = params;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  bVar1 = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  if (bVar1) {
    this_00 = &body_1.content.disposer;
    HttpHeaders::HttpHeaders((HttpHeaders *)this_00,*(HttpHeaderTable **)(lVar8 + 8));
    (**(code **)(*in_stack_00000010 + 8))(local_338,in_stack_00000010,this_00);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&body_1.content.disposer);
    HttpHeaders::get(&local_3c8,local_38,(HttpHeaderId)(ZEXT416(0xb) << 0x40));
    StringPtr::StringPtr((StringPtr *)&sendPromise.super_PromiseBase.node.ptr,"null");
    pkVar2 = (kj *)Maybe<kj::StringPtr>::orDefault
                             (&local_3c8,(StringPtr *)&sendPromise.super_PromiseBase.node.ptr);
    str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
              ((String *)local_3b0,pkVar2,(StringPtr *)0x6781e9,(char (*) [2])&this_local,
               (StringPtr *)headers);
    Maybe<kj::StringPtr>::~Maybe(&local_3c8);
    pWVar6 = Own<kj::WebSocket>::operator->((Own<kj::WebSocket> *)local_338);
    AVar9 = String::operator_cast_to_ArrayPtr((String *)local_3b0);
    promises_1.disposer = (ArrayDisposer *)AVar9.ptr;
    (*pWVar6->_vptr_WebSocket[1])(local_3f8,pWVar6,promises_1.disposer,AVar9.size_);
    heapArrayBuilder<kj::Promise<void>>
              ((ArrayBuilder<kj::Promise<void>_> *)local_428,(kj *)0x2,size_00);
    mv<kj::String>((String *)local_3b0);
    Promise<void>::attach<kj::String>(&local_438,(String *)local_3f8);
    ArrayBuilder<kj::Promise<void>>::add<kj::Promise<void>>
              ((ArrayBuilder<kj::Promise<void>> *)local_428,&local_438);
    Promise<void>::~Promise(&local_438);
    pWVar6 = Own<kj::WebSocket>::operator->((Own<kj::WebSocket> *)local_338);
    (*pWVar6->_vptr_WebSocket[6])(&local_458);
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ignoreResult
              (&local_448);
    ArrayBuilder<kj::Promise<void>>::add<kj::Promise<void>>
              ((ArrayBuilder<kj::Promise<void>> *)local_428,(Promise<void> *)&local_448);
    Promise<void>::~Promise((Promise<void> *)&local_448);
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~Promise
              (&local_458);
    ArrayBuilder<kj::Promise<void>_>::finish
              (&local_480,(ArrayBuilder<kj::Promise<void>_> *)local_428);
    joinPromises((kj *)&local_468,&local_480);
    mv<kj::Own<kj::WebSocket>>((Own<kj::WebSocket> *)local_338);
    Promise<void>::attach<kj::Own<kj::WebSocket>>((Promise<void> *)this,&local_468);
    Promise<void>::~Promise((Promise<void> *)&local_468);
    Array<kj::Promise<void>_>::~Array(&local_480);
    ArrayBuilder<kj::Promise<void>_>::~ArrayBuilder((ArrayBuilder<kj::Promise<void>_> *)local_428);
    Promise<void>::~Promise((Promise<void> *)local_3f8);
    String::~String((String *)local_3b0);
    Own<kj::WebSocket>::~Own((Own<kj::WebSocket> *)local_338);
    pPVar7 = extraout_RDX_01;
  }
  else {
    StringPtr::StringPtr(&local_48,"/throw");
    bVar1 = StringPtr::operator==((StringPtr *)&this_local,&local_48);
    if (bVar1) {
      _::Debug::makeDescription<char_const(&)[25]>
                (&local_1b8,(Debug *)"\"client requested failure\"","client requested failure",
                 (char (*) [25])params);
      Exception::Exception
                (&local_1a0,FAILED,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0xb37,&local_1b8);
      Promise<void>::Promise((Promise<void> *)this,&local_1a0);
      Exception::~Exception(&local_1a0);
      String::~String(&local_1b8);
      pPVar7 = extraout_RDX;
    }
    else {
      HttpHeaders::get(&local_1f8,local_38,(HttpHeaderId)(ZEXT416(0xb) << 0x40));
      StringPtr::StringPtr((StringPtr *)&stream.ptr,"null");
      pkVar2 = (kj *)Maybe<kj::StringPtr>::orDefault(&local_1f8,(StringPtr *)&stream.ptr);
      str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
                ((String *)local_1e0,pkVar2,(StringPtr *)0x6781e9,(char (*) [2])&this_local,
                 (StringPtr *)headers);
      Maybe<kj::StringPtr>::~Maybe(&local_1f8);
      StringPtr::StringPtr(&local_238,"OK");
      HttpHeaders::HttpHeaders(&local_298,*(HttpHeaderTable **)(lVar8 + 8));
      promises.disposer = (ArrayDisposer *)String::size((String *)local_1e0);
      Maybe<unsigned_long>::Maybe(&local_2a8,(unsigned_long *)&promises.disposer);
      (**(code **)*in_stack_00000010)
                (local_228,in_stack_00000010,200,local_238.content.ptr,local_238.content.size_,
                 &local_298,&local_2a8);
      Maybe<unsigned_long>::~Maybe(&local_2a8);
      HttpHeaders::~HttpHeaders(&local_298);
      heapArrayBuilder<kj::Promise<void>>
                ((ArrayBuilder<kj::Promise<void>_> *)local_2d0,(kj *)0x2,size);
      pAVar3 = Own<kj::AsyncOutputStream>::operator->((Own<kj::AsyncOutputStream> *)local_228);
      pcVar4 = String::begin((String *)local_1e0);
      sVar5 = String::size((String *)local_1e0);
      (**pAVar3->_vptr_AsyncOutputStream)(&local_2e0,pAVar3,pcVar4,sVar5);
      ArrayBuilder<kj::Promise<void>>::add<kj::Promise<void>>
                ((ArrayBuilder<kj::Promise<void>> *)local_2d0,&local_2e0);
      Promise<void>::~Promise(&local_2e0);
      MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
      AsyncInputStream::readAllBytes((AsyncInputStream *)&local_300,(uint64_t)response);
      Promise<kj::Array<unsigned_char>_>::ignoreResult(&local_2f0);
      ArrayBuilder<kj::Promise<void>>::add<kj::Promise<void>>
                ((ArrayBuilder<kj::Promise<void>> *)local_2d0,(Promise<void> *)&local_2f0);
      Promise<void>::~Promise((Promise<void> *)&local_2f0);
      Promise<kj::Array<unsigned_char>_>::~Promise(&local_300);
      ArrayBuilder<kj::Promise<void>_>::finish
                ((Array<kj::Promise<void>_> *)&ws.ptr,(ArrayBuilder<kj::Promise<void>_> *)local_2d0)
      ;
      joinPromises((kj *)&local_310,(Array<kj::Promise<void>_> *)&ws.ptr);
      attachments_1 = mv<kj::Own<kj::AsyncOutputStream>>((Own<kj::AsyncOutputStream> *)local_228);
      mv<kj::String>((String *)local_1e0);
      Promise<void>::attach<kj::Own<kj::AsyncOutputStream>,kj::String>
                ((Promise<void> *)this,&local_310,(String *)attachments_1);
      Promise<void>::~Promise((Promise<void> *)&local_310);
      Array<kj::Promise<void>_>::~Array((Array<kj::Promise<void>_> *)&ws.ptr);
      ArrayBuilder<kj::Promise<void>_>::~ArrayBuilder((ArrayBuilder<kj::Promise<void>_> *)local_2d0)
      ;
      Own<kj::AsyncOutputStream>::~Own((Own<kj::AsyncOutputStream> *)local_228);
      String::~String((String *)local_1e0);
      pPVar7 = extraout_RDX_00;
    }
  }
  PVar10.super_PromiseBase.node.ptr = pPVar7;
  PVar10.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar10.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    if (!headers.isWebSocket()) {
      if (url == "/throw") {
        return KJ_EXCEPTION(FAILED, "client requested failure");
      }

      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto stream = response.send(200, "OK", HttpHeaders(headerTable), body.size());
      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(stream->write(body.begin(), body.size()));
      promises.add(requestBody.readAllBytes().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(stream), kj::mv(body));
    } else {
      auto ws = response.acceptWebSocket(HttpHeaders(headerTable));
      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto sendPromise = ws->send(body);

      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(sendPromise.attach(kj::mv(body)));
      promises.add(ws->receive().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(ws));
    }
  }